

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O0

void BLAKE2B256(uint8_t *data,size_t len,uint8_t *out)

{
  undefined1 local_f8 [8];
  BLAKE2B_CTX ctx;
  uint8_t *out_local;
  size_t len_local;
  uint8_t *data_local;
  
  ctx.block_used = (size_t)out;
  BLAKE2B256_Init((BLAKE2B_CTX *)local_f8);
  BLAKE2B256_Update((BLAKE2B_CTX *)local_f8,data,len);
  BLAKE2B256_Final((uint8_t *)ctx.block_used,(BLAKE2B_CTX *)local_f8);
  return;
}

Assistant:

void BLAKE2B256(const uint8_t *data, size_t len,
                uint8_t out[BLAKE2B256_DIGEST_LENGTH]) {
  BLAKE2B_CTX ctx;
  BLAKE2B256_Init(&ctx);
  BLAKE2B256_Update(&ctx, data, len);
  BLAKE2B256_Final(out, &ctx);
}